

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindowPrivate::beginPaint(QOpenGLWindowPrivate *this,QRegion *region)

{
  bool bVar1;
  int iVar2;
  socklen_t __len;
  int iVar3;
  QOpenGLWindow *pQVar4;
  QOpenGLContext *pQVar5;
  QOpenGLWindowPaintDevice *size;
  QOpenGLWindowPaintDevice *this_00;
  QOpenGLFramebufferObject *this_01;
  sockaddr *__addr;
  QOpenGLWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  int samples;
  int deviceHeight;
  int deviceWidth;
  QOpenGLWindow *q;
  QOpenGLFramebufferObjectFormat fboFormat;
  QSize deviceSize;
  QSize *in_stack_ffffffffffffff28;
  QOpenGLPaintDevice *in_stack_ffffffffffffff30;
  QOpenGLFramebufferObject *in_stack_ffffffffffffff38;
  QMessageLogger *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar7;
  QOpenGLWindowPrivate *in_stack_ffffffffffffff70;
  QOpenGLFramebufferObjectFormat *format;
  undefined4 in_stack_ffffffffffffff88;
  int iVar8;
  char local_48 [32];
  QSurfaceFormat local_28 [8];
  undefined8 local_20;
  QSize local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  initialize(in_stack_ffffffffffffff70);
  pQVar5 = QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
                     (&in_RDI->context);
  format = (QOpenGLFramebufferObjectFormat *)0x0;
  if (pQVar4 != (QOpenGLWindow *)0x0) {
    format = (QOpenGLFramebufferObjectFormat *)&pQVar4->field_0x10;
  }
  QOpenGLContext::makeCurrent((QSurface *)pQVar5);
  iVar2 = QWindow::width((QWindow *)in_stack_ffffffffffffff28);
  dVar6 = (double)QWindow::devicePixelRatio();
  __len = (socklen_t)((double)iVar2 * dVar6);
  iVar2 = QWindow::height((QWindow *)in_stack_ffffffffffffff28);
  dVar6 = (double)QWindow::devicePixelRatio();
  iVar2 = (int)((double)iVar2 * dVar6);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (int)in_stack_ffffffffffffff28);
  if ((int)in_RDI->updateBehavior < 1) {
    QPaintDeviceWindowPrivate::markWindowAsDirty
              ((QPaintDeviceWindowPrivate *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else {
    bVar1 = QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
            ::operator!(&in_RDI->fbo);
    uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffff54);
    if (!bVar1) {
      QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
      operator->(&in_RDI->fbo);
      local_18 = QOpenGLFramebufferObject::size
                           ((QOpenGLFramebufferObject *)in_stack_ffffffffffffff30);
      bVar1 = ::operator!=((QSize *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      uVar7 = CONCAT13(bVar1,(int3)uVar7);
    }
    if ((char)((uint)uVar7 >> 0x18) != '\0') {
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QOpenGLFramebufferObjectFormat::QOpenGLFramebufferObjectFormat
                ((QOpenGLFramebufferObjectFormat *)in_stack_ffffffffffffff30);
      QOpenGLFramebufferObjectFormat::setAttachment
                ((QOpenGLFramebufferObjectFormat *)in_stack_ffffffffffffff30,
                 (Attachment)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      QWindow::requestedFormat();
      iVar3 = QSurfaceFormat::samples();
      QSurfaceFormat::~QSurfaceFormat(local_28);
      iVar8 = iVar3;
      if (0 < iVar3) {
        if (in_RDI->updateBehavior == PartialUpdateBlend) {
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                     (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (char *)in_stack_ffffffffffffff28);
          QMessageLogger::warning
                    (local_48,"QOpenGLWindow: PartialUpdateBlend does not support multisampling");
        }
        else {
          QOpenGLFramebufferObjectFormat::setSamples
                    ((QOpenGLFramebufferObjectFormat *)in_stack_ffffffffffffff30,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        }
      }
      operator_new(0x10);
      QOpenGLFramebufferObject::QOpenGLFramebufferObject
                ((QOpenGLFramebufferObject *)CONCAT44(__len,iVar2),
                 (QSize *)CONCAT44(iVar8,in_stack_ffffffffffffff88),format);
      QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
      reset((QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
             *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      QPaintDeviceWindowPrivate::markWindowAsDirty
                ((QPaintDeviceWindowPrivate *)CONCAT44(uVar7,iVar3));
      QOpenGLFramebufferObjectFormat::~QOpenGLFramebufferObjectFormat
                ((QOpenGLFramebufferObjectFormat *)in_stack_ffffffffffffff30);
    }
  }
  size = QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
         ::operator->(&in_RDI->paintDevice);
  QSize::QSize((QSize *)in_stack_ffffffffffffff30,(int)((ulong)size >> 0x20),(int)size);
  QOpenGLPaintDevice::setSize(in_stack_ffffffffffffff30,(QSize *)size);
  this_00 = QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
            ::operator->(&in_RDI->paintDevice);
  QWindow::devicePixelRatio();
  QOpenGLPaintDevice::setDevicePixelRatio(&this_00->super_QOpenGLPaintDevice,(qreal)size);
  QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
            (&in_RDI->context);
  QOpenGLContext::functions();
  QOpenGLFunctions::glViewport
            ((QOpenGLFunctions *)this_00,(GLint)((ulong)size >> 0x20),(GLint)size,0,0x1b5e8d);
  QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
            (&in_RDI->context);
  QOpenGLContext::functions();
  QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::operator->
            (&in_RDI->context);
  QOpenGLContext::defaultFramebufferObject();
  iVar2 = 0x8d40;
  QOpenGLFunctions::glBindFramebuffer
            ((QOpenGLFunctions *)this_00,(GLenum)((ulong)size >> 0x20),(GLuint)size);
  (**(code **)(*(long *)pQVar4 + 0x150))();
  if (0 < (int)in_RDI->updateBehavior) {
    this_01 = QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
              ::operator->(&in_RDI->fbo);
    QOpenGLFramebufferObject::bind(this_01,iVar2,__addr,__len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLWindowPrivate::beginPaint(const QRegion &region)
{
    Q_UNUSED(region);
    Q_Q(QOpenGLWindow);

    initialize();
    context->makeCurrent(q);

    const int deviceWidth = q->width() * q->devicePixelRatio();
    const int deviceHeight = q->height() * q->devicePixelRatio();
    const QSize deviceSize(deviceWidth, deviceHeight);
    if (updateBehavior > QOpenGLWindow::NoPartialUpdate) {
        if (!fbo || fbo->size() != deviceSize) {
            QOpenGLFramebufferObjectFormat fboFormat;
            fboFormat.setAttachment(QOpenGLFramebufferObject::CombinedDepthStencil);
            const int samples = q->requestedFormat().samples();
            if (samples > 0) {
                if (updateBehavior != QOpenGLWindow::PartialUpdateBlend)
                    fboFormat.setSamples(samples);
                else
                    qWarning("QOpenGLWindow: PartialUpdateBlend does not support multisampling");
            }
            fbo.reset(new QOpenGLFramebufferObject(deviceSize, fboFormat));
            markWindowAsDirty();
        }
    } else {
        markWindowAsDirty();
    }

    paintDevice->setSize(QSize(deviceWidth, deviceHeight));
    paintDevice->setDevicePixelRatio(q->devicePixelRatio());
    context->functions()->glViewport(0, 0, deviceWidth, deviceHeight);

    context->functions()->glBindFramebuffer(GL_FRAMEBUFFER, context->defaultFramebufferObject());

    q->paintUnderGL();

    if (updateBehavior > QOpenGLWindow::NoPartialUpdate)
        fbo->bind();
}